

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall amrex::MLABecLaplacian::define_ab_coeffs(MLABecLaplacian *this)

{
  int iVar1;
  int *piVar2;
  MultiFab *pMVar3;
  BoxArray *pBVar4;
  DistributionMapping *pDVar5;
  reference pvVar6;
  long *in_RDI;
  BoxArray *ba;
  int idim;
  int mglev;
  int amrlev;
  int ncomp;
  type in_stack_fffffffffffffe48;
  BoxArray *in_stack_fffffffffffffe50;
  BoxArray *in_stack_fffffffffffffe60;
  BoxArray *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  uint in_stack_fffffffffffffe74;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  int local_108 [2];
  int local_100;
  int local_f8 [2];
  int local_f0;
  BoxArray local_e8;
  BoxArray *local_80;
  int local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_34;
  int local_30;
  uint local_2c;
  int local_20 [2];
  int local_18;
  int local_10;
  IntVect local_c;
  
  local_2c = (**(code **)(*in_RDI + 0x28))();
  std::
  vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::resize((vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
           (size_type)in_stack_fffffffffffffe68);
  std::
  vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::resize((vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
           (size_type)in_stack_fffffffffffffe68);
  for (local_30 = 0; local_30 < *(int *)((long)in_RDI + 0x34); local_30 = local_30 + 1) {
    Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                  *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
               (size_type)in_stack_fffffffffffffe48);
    std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::resize
              ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (size_type)in_stack_fffffffffffffe68);
    Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                  *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
               (size_type)in_stack_fffffffffffffe48);
    std::
    vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
    resize((vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
            *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
           (size_type)in_stack_fffffffffffffe68);
    for (local_34 = 0; iVar1 = local_34,
        piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
                            (size_type)in_stack_fffffffffffffe48), iVar1 < *piVar2;
        local_34 = local_34 + 1) {
      Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      pMVar3 = Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                         ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                          in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                    *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      pBVar4 = Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                         ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                          in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
      ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                    *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      pDVar5 = Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
               operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_48 = 0;
      MFInfo::MFInfo((MFInfo *)0x12b179e);
      Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                    *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe48 =
           std::
           unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        *)in_stack_fffffffffffffe50);
      (*(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                (pMVar3,pBVar4,pDVar5,1,0,&local_68);
      MFInfo::~MFInfo((MFInfo *)0x12b1818);
      for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
        Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                      *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                  ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                   in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        local_10 = local_78;
        if (local_78 == 0) {
          IntVect::IntVect(&local_c,1,0,0);
        }
        else if (local_78 == 1) {
          IntVect::IntVect(&local_c,0,1,0);
        }
        else {
          IntVect::IntVect(&local_c,0,0,1);
        }
        local_18 = local_c.vect[2];
        local_20[0] = local_c.vect[0];
        local_20[1] = local_c.vect[1];
        local_100 = local_c.vect[2];
        local_108[0] = local_c.vect[0];
        local_108[1] = local_c.vect[1];
        local_f0 = local_c.vect[2];
        local_f8[0] = local_c.vect[0];
        local_f8[1] = local_c.vect[1];
        in_stack_fffffffffffffe50 = &local_e8;
        convert(in_stack_fffffffffffffe68,(IntVect *)in_stack_fffffffffffffe60);
        local_80 = in_stack_fffffffffffffe50;
        Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                      *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                      *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        pvVar6 = std::array<amrex::MultiFab,_3UL>::operator[]
                           ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffe50,
                            (size_type)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe60 = local_80;
        Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
        ::operator[]((Vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                      *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe68 =
             (BoxArray *)
             Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::
             operator[]((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                         *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        local_128 = 0;
        uStack_120 = 0;
        local_138 = 0;
        uStack_130 = 0;
        local_118 = 0;
        in_stack_fffffffffffffe74 = local_2c;
        MFInfo::MFInfo((MFInfo *)0x12b19ff);
        Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
        ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                      *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
        ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      *)in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffe48 =
             std::
             unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ::operator*((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          *)in_stack_fffffffffffffe50);
        (*(pvVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                  (pvVar6,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                   (ulong)in_stack_fffffffffffffe74,0,&local_138);
        MFInfo::~MFInfo((MFInfo *)0x12b1a78);
        BoxArray::~BoxArray(in_stack_fffffffffffffe50);
      }
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::define_ab_coeffs ()
{
    const int ncomp = getNComp();

    m_a_coeffs.resize(m_num_amr_levels);
    m_b_coeffs.resize(m_num_amr_levels);
    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_a_coeffs[amrlev].resize(m_num_mg_levels[amrlev]);
        m_b_coeffs[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_a_coeffs[amrlev][mglev].define(m_grids[amrlev][mglev],
                                             m_dmap[amrlev][mglev],
                                             1, 0, MFInfo(), *m_factory[amrlev][mglev]);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                const BoxArray& ba = amrex::convert(m_grids[amrlev][mglev],
                                                    IntVect::TheDimensionVector(idim));
                m_b_coeffs[amrlev][mglev][idim].define(ba,
                                                       m_dmap[amrlev][mglev],
                                                       ncomp, 0, MFInfo(), *m_factory[amrlev][mglev]);
            }
        }
    }
}